

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O0

SRes SeqInStream_Read(ISeqInStream *stream,void *buf,size_t size)

{
  SRes SVar1;
  undefined8 in_RSI;
  size_t in_RDI;
  
  SVar1 = SeqInStream_Read2((ISeqInStream *)buf,(void *)size,in_RDI,(SRes)((ulong)in_RSI >> 0x20));
  return SVar1;
}

Assistant:

SRes SeqInStream_Read(ISeqInStream *stream, void *buf, size_t size)
{
  return SeqInStream_Read2(stream, buf, size, SZ_ERROR_INPUT_EOF);
}